

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::TraverseSchema::isSubstitutionGroupCircular
          (TraverseSchema *this,SchemaElementDecl *elemDecl,SchemaElementDecl *subsElemDecl)

{
  SchemaElementDecl *local_30;
  SchemaElementDecl *tmpElemDecl;
  SchemaElementDecl *subsElemDecl_local;
  SchemaElementDecl *elemDecl_local;
  TraverseSchema *this_local;
  
  if (elemDecl == subsElemDecl) {
    this_local._7_1_ = true;
  }
  else {
    for (local_30 = SchemaElementDecl::getSubstitutionGroupElem(subsElemDecl);
        local_30 != (SchemaElementDecl *)0x0;
        local_30 = SchemaElementDecl::getSubstitutionGroupElem(local_30)) {
      if (local_30 == elemDecl) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TraverseSchema::isSubstitutionGroupCircular(SchemaElementDecl* const elemDecl,
                                                 SchemaElementDecl* const subsElemDecl)
{

    if (elemDecl == subsElemDecl)
        return true;

    SchemaElementDecl* tmpElemDecl = subsElemDecl->getSubstitutionGroupElem();

    while (tmpElemDecl)
    {
        if (tmpElemDecl == elemDecl)
            return true;

        tmpElemDecl = tmpElemDecl->getSubstitutionGroupElem();
    }

    return false;
}